

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmregex.cpp
# Opt level: O0

void __thiscall CRegexParser::build_char_range(CRegexParser *this,re_machine *machine,int exclusion)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  wchar_t *__dest;
  re_recog_type typ;
  int in_EDX;
  re_state_id *in_RSI;
  CRegexParser *in_RDI;
  wchar_t *range_copy;
  CRegexParser *in_stack_ffffffffffffffe0;
  
  init_machine(in_stack_ffffffffffffffe0,(re_machine *)in_RDI);
  typ = RE_RANGE;
  if (in_EDX != 0) {
    typ = RE_RANGE_EXCL;
  }
  set_trans(in_RDI,*in_RSI,in_RSI[1],typ,L'\0');
  auVar1._8_8_ = 0;
  auVar1._0_8_ = in_RDI->range_buf_cnt_;
  uVar2 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  __dest = (wchar_t *)operator_new__(uVar2);
  memcpy(__dest,in_RDI->range_buf_,in_RDI->range_buf_cnt_ << 2);
  in_RDI->tuple_arr_[*in_RSI].info.str.str = __dest;
  in_RDI->tuple_arr_[*in_RSI].info.range.char_range_cnt = in_RDI->range_buf_cnt_;
  return;
}

Assistant:

void CRegexParser::build_char_range(re_machine *machine,
                                    int exclusion)
{
    /* initialize our new machine */
    init_machine(machine);

    /* allocate a transition table for the new state */
    set_trans(machine->init, machine->final,
              (exclusion ? RE_RANGE_EXCL : RE_RANGE), 0);

    /* allocate a copy of the range vector */
    wchar_t *range_copy = new wchar_t[range_buf_cnt_];

    /* copy the caller's range */
    memcpy(range_copy, range_buf_, range_buf_cnt_ * sizeof(wchar_t));

    /* store it in the tuple */
    tuple_arr_[machine->init].info.range.char_range = range_copy;
    tuple_arr_[machine->init].info.range.char_range_cnt = range_buf_cnt_;
}